

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_initFastDStream(BYTE *ip)

{
  uint uVar1;
  size_t sVar2;
  long in_RDI;
  size_t value;
  size_t bitsConsumed;
  BYTE lastByte;
  undefined4 in_stack_ffffffffffffffd8;
  
  if (*(char *)(in_RDI + 7) == '\0') {
    uVar1 = 0;
  }
  else {
    uVar1 = ZSTD_highbit32(0);
    uVar1 = 8 - uVar1;
  }
  sVar2 = MEM_readLEST((void *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
  if (uVar1 < 9) {
    return (sVar2 | 1) << ((byte)uVar1 & 0x3f);
  }
  __assert_fail("bitsConsumed <= 8",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x8cca,"size_t HUF_initFastDStream(const BYTE *)");
}

Assistant:

static size_t HUF_initFastDStream(BYTE const* ip) {
    BYTE const lastByte = ip[7];
    size_t const bitsConsumed = lastByte ? 8 - ZSTD_highbit32(lastByte) : 0;
    size_t const value = MEM_readLEST(ip) | 1;
    assert(bitsConsumed <= 8);
    assert(sizeof(size_t) == 8);
    return value << bitsConsumed;
}